

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGearConstraint.cpp
# Opt level: O0

void __thiscall btGearConstraint::getInfo2(btGearConstraint *this,btConstraintInfo2 *info)

{
  float fVar1;
  btTransform *pbVar2;
  btScalar *pbVar3;
  long in_RSI;
  btVector3 *in_RDI;
  btVector3 bVar4;
  btVector3 globalAxisB;
  btVector3 globalAxisA;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  btScalar bVar5;
  btVector3 local_38;
  btVector3 local_28;
  long local_10;
  
  local_10 = in_RSI;
  btVector3::btVector3(&local_28);
  btVector3::btVector3(&local_38);
  pbVar2 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI[2].m_floats + 2));
  btTransform::getBasis(pbVar2);
  bVar4 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_RDI);
  local_28.m_floats._8_8_ = bVar4.m_floats._8_8_;
  local_28.m_floats._0_8_ = bVar4.m_floats._0_8_;
  pbVar2 = btCollisionObject::getWorldTransform(*(btCollisionObject **)in_RDI[3].m_floats);
  btTransform::getBasis(pbVar2);
  bVar4 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_RDI);
  local_38.m_floats._8_8_ = bVar4.m_floats._8_8_;
  local_38.m_floats._0_8_ = bVar4.m_floats._0_8_;
  pbVar3 = btVector3::operator_cast_to_float_(&local_28);
  **(btScalar **)(local_10 + 0x10) = *pbVar3;
  pbVar3 = btVector3::operator_cast_to_float_(&local_28);
  *(btScalar *)(*(long *)(local_10 + 0x10) + 4) = pbVar3[1];
  pbVar3 = btVector3::operator_cast_to_float_(&local_28);
  *(btScalar *)(*(long *)(local_10 + 0x10) + 8) = pbVar3[2];
  fVar1 = in_RDI[6].m_floats[3];
  pbVar3 = btVector3::operator_cast_to_float_(&local_38);
  **(float **)(local_10 + 0x20) = fVar1 * *pbVar3;
  fVar1 = in_RDI[6].m_floats[3];
  pbVar3 = btVector3::operator_cast_to_float_(&local_38);
  *(float *)(*(long *)(local_10 + 0x20) + 4) = fVar1 * pbVar3[1];
  bVar5 = in_RDI[6].m_floats[3];
  pbVar3 = btVector3::operator_cast_to_float_(&local_38);
  *(float *)(*(long *)(local_10 + 0x20) + 8) = bVar5 * pbVar3[2];
  return;
}

Assistant:

void btGearConstraint::getInfo2 (btConstraintInfo2* info)
{
	btVector3 globalAxisA, globalAxisB;

	globalAxisA = m_rbA.getWorldTransform().getBasis()*this->m_axisInA;
	globalAxisB = m_rbB.getWorldTransform().getBasis()*this->m_axisInB;

	info->m_J1angularAxis[0] = globalAxisA[0];
	info->m_J1angularAxis[1] = globalAxisA[1];
	info->m_J1angularAxis[2] = globalAxisA[2];

	info->m_J2angularAxis[0] = m_ratio*globalAxisB[0];
	info->m_J2angularAxis[1] = m_ratio*globalAxisB[1];
	info->m_J2angularAxis[2] = m_ratio*globalAxisB[2];

}